

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O3

void __thiscall QZipWriter::addDirectory(QZipWriter *this,QString *dirName)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArray local_58;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators(dirName);
  bVar1 = QString::endsWith(&local_38,(QChar)0x2f,CaseSensitive);
  if (!bVar1) {
    QString::append(&local_38,(QChar)0x2f);
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  QZipWriterPrivate::addEntry(this->d,Directory,&local_38,&local_58);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QZipWriter::addDirectory(const QString &dirName)
{
    QString name(QDir::fromNativeSeparators(dirName));
    // separator is mandatory
    if (!name.endsWith(u'/'))
        name.append(u'/');
    d->addEntry(QZipWriterPrivate::Directory, name, QByteArray());
}